

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolygonIntegrationPoints.h
# Opt level: O2

IntegrationPointList<2> *
anurbs::PolygonIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,Index degree,Polygon *polygon)

{
  double dVar1;
  pointer ptVar2;
  pointer ptVar3;
  IntegrationPointList<3> *pIVar4;
  long lVar5;
  pointer ptVar6;
  ulong index;
  long lVar7;
  CoeffReturnType CVar8;
  CoeffReturnType CVar9;
  Vector2d ac;
  Vector2d ab;
  Vector2d vertex_c;
  Vector2d vertex_b;
  Vector2d vertex_a;
  PolygonTessellation tessellation;
  TriangleIndices local_190;
  double local_178;
  undefined8 uStack_170;
  type local_160;
  type local_140;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const>>
  local_120 [8];
  LhsNested local_118;
  double local_108;
  LhsNested local_f8;
  double local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  uv;
  type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tessellation.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tessellation.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tessellation.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PolygonTessellation::compute(&tessellation,polygon);
  pIVar4 = IntegrationPoints::xiao_gimbutas(degree);
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  resize(__return_storage_ptr__,
         ((long)(pIVar4->
                super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar4->
                super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5) *
         ((ulong)((long)tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) / 3));
  lVar7 = 0;
  for (index = 0;
      index < (ulong)((long)tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)tessellation.m_triangles.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) / 3; index = index + 1)
  {
    PolygonTessellation::triangle(&local_190,&tessellation,index);
    Polygon::vertex((Polygon *)&vertex_a,(Index)polygon);
    Polygon::vertex((Polygon *)&vertex_b,(Index)polygon);
    Polygon::vertex((Polygon *)&vertex_c,(Index)polygon);
    uv._0_8_ = &vertex_b;
    uv.m_lhs._0_8_ = &vertex_a;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&ab,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&uv);
    uv._0_8_ = &vertex_c;
    uv.m_lhs._0_8_ = &vertex_a;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)&ac,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&uv);
    local_178 = ABS(ac.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                    .array[0] *
                    ab.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                    .array[1] -
                    ab.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                    .array[0] *
                    ac.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                    .array[1]) * 0.5;
    uStack_170 = 0;
    ptVar2 = (pIVar4->
             super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = lVar7 * 0x18 + 0x10;
    for (ptVar6 = (pIVar4->
                  super__Vector_base<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ptVar6 != ptVar2; ptVar6 = ptVar6 + 1)
    {
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_140,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)&vertex_a,
                 &(ptVar6->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Head_base<0UL,_double,_false>._M_head_impl);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_160,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)&vertex_b,
                 &(ptVar6->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Tuple_impl<1UL,_double,_double,_double>.
                  super__Head_base<1UL,_double,_false>._M_head_impl);
      local_118 = local_140.m_lhs;
      local_108 = local_140.m_rhs.m_functor.m_other;
      local_f8 = local_160.m_lhs;
      local_e8 = local_160.m_rhs.m_functor.m_other;
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_50,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)&vertex_c,
                 &(ptVar6->super__Tuple_impl<0UL,_double,_double,_double,_double>).
                  super__Tuple_impl<1UL,_double,_double,_double>.
                  super__Tuple_impl<2UL,_double,_double>.super__Head_base<2UL,_double,_false>.
                  _M_head_impl);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const>>
      ::operator+(&uv,local_120,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   *)&local_50);
      CVar8 = Eigen::
              DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
              ::coeff((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
                       *)&uv,0);
      CVar9 = Eigen::
              DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
              ::coeff((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
                       *)&uv,1);
      dVar1 = (ptVar6->super__Tuple_impl<0UL,_double,_double,_double,_double>).
              super__Tuple_impl<1UL,_double,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
              super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl;
      lVar7 = lVar7 + 1;
      ptVar3 = (__return_storage_ptr__->
               super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(CoeffReturnType *)
       ((long)&(ptVar3->super__Tuple_impl<0UL,_double,_double,_double>).
               super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double> + lVar5) =
           CVar8;
      *(CoeffReturnType *)((long)ptVar3 + lVar5 + -8) = CVar9;
      *(double *)((long)ptVar3 + lVar5 + -0x10) = dVar1 * local_178;
      lVar5 = lVar5 + 0x18;
    }
  }
  PolygonTessellation::~PolygonTessellation(&tessellation);
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const Index degree, const Polygon& polygon)
    {
        using Vector2d = Eigen::Matrix<double, 1, 2>;

        IntegrationPointList<2> integration_points;
        PolygonTessellation tessellation;

        tessellation.compute(polygon);

        const auto& xiao_gimbutas = IntegrationPoints::xiao_gimbutas(degree);

        const Index nb_integration_points = tessellation.nb_triangles() *
            static_cast<Index>(xiao_gimbutas.size());

        integration_points.resize(nb_integration_points);

        Index j = 0;

        for (Index i = 0; i < tessellation.nb_triangles(); i++) {
            const auto [a, b, c] = tessellation.triangle(i);

            const Vector2d vertex_a = polygon.vertex(a);
            const Vector2d vertex_b = polygon.vertex(b);
            const Vector2d vertex_c = polygon.vertex(c);

            const Vector2d ab = vertex_b - vertex_a;
            const Vector2d ac = vertex_c - vertex_a;

            const double area = 0.5 * norm(cross(ab, ac));

            for (const auto& norm_point : xiao_gimbutas) {
                const auto uv = vertex_a * std::get<0>(norm_point) +
                                vertex_b * std::get<1>(norm_point) +
                                vertex_c * std::get<2>(norm_point);

                integration_points[j++] = IntegrationPoint<2>(uv[0], uv[1],
                    area * std::get<3>(norm_point));
            }
        }

        return integration_points;
    }